

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall spvtools::anon_unknown_0::Disassembler::~Disassembler(Disassembler *this)

{
  pointer this_00;
  long lVar1;
  allocator<spvtools::(anonymous_namespace)::SingleBlock> *in_RDX;
  
  std::
  _Destroy<spvtools::(anonymous_namespace)::SingleBlock*,spvtools::(anonymous_namespace)::SingleBlock>
            ((this->current_function_cfg_).blocks.
             super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->current_function_cfg_).blocks.
             super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish,in_RDX);
  this_00 = (this->current_function_cfg_).blocks.
            super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
  std::
  _Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
  ::_M_deallocate((_Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                   *)this_00,(pointer)(lVar1 / 0x58),lVar1 % 0x58);
  disassemble::InstructionDisassembler::~InstructionDisassembler(&this->instruction_disassembler_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->text_);
  return;
}

Assistant:

Disassembler(const AssemblyGrammar& grammar, uint32_t options,
               NameMapper name_mapper)
      : print_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_PRINT, options)),
        nested_indent_(
            spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NESTED_INDENT, options)),
        reorder_blocks_(
            spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_REORDER_BLOCKS, options)),
        text_(),
        out_(print_ ? out_stream() : out_stream(text_)),
        instruction_disassembler_(grammar, out_.get(), options, name_mapper),
        header_(!spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NO_HEADER, options)),
        byte_offset_(0) {}